

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_safecopy(BYTE *op,BYTE *oend_w,BYTE *ip,ptrdiff_t length,ZSTD_overlap_e ovtype)

{
  ulong uVar1;
  undefined1 *puVar2;
  long in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  undefined1 *puVar3;
  int in_R8D;
  BYTE *oend;
  ptrdiff_t diff;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_2;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  int sub2;
  long local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  long local_88;
  long local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  long local_48;
  long local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  int local_1c;
  ulong local_18;
  undefined1 **local_10;
  undefined1 **local_8;
  
  uVar1 = (long)in_RDI - (long)in_RDX;
  puVar2 = in_RDI + in_RCX;
  if (((in_R8D != 0) || (((-8 < (long)uVar1 && ((long)uVar1 < 8)) && (in_RDI < in_RSI)))) &&
     ((in_R8D != 1 || ((long)uVar1 < 0)))) {
    __assert_fail("(ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) || (ovtype == ZSTD_overlap_src_before_dst && diff >= 0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa7a8,
                  "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                 );
  }
  local_b8 = in_RDX;
  puVar3 = in_RDI;
  if (in_RCX < 8) {
    while (local_a8 = puVar3, local_a8 < puVar2) {
      *local_a8 = *local_b8;
      local_b8 = local_b8 + 1;
      puVar3 = local_a8 + 1;
    }
  }
  else {
    local_c0 = in_RCX;
    local_b0 = in_RSI;
    puVar3 = in_RDI;
    if (in_R8D == 1) {
      if (in_RCX < 8) {
        __assert_fail("length >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa7b1,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
      local_8 = &local_a8;
      local_10 = &local_b8;
      local_18 = uVar1;
      if (in_RDI < in_RDX) {
        __assert_fail("*ip <= *op",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
      }
      if (uVar1 < 8) {
        local_1c = *(int *)(ZSTD_overlapCopy8_dec64table + uVar1 * 4);
        *in_RDI = *in_RDX;
        in_RDI[1] = in_RDX[1];
        in_RDI[2] = in_RDX[2];
        in_RDI[3] = in_RDX[3];
        local_b8 = in_RDX + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar1 * 4);
        puVar3 = local_a8 + 4;
        local_a8 = in_RDI;
        ZSTD_copy4(puVar3,local_b8);
        *local_10 = *local_10 + -(long)local_1c;
      }
      else {
        local_a8 = in_RDI;
        ZSTD_copy8(in_RDI,in_RDX);
      }
      *local_10 = *local_10 + 8;
      *local_8 = *local_8 + 8;
      if ((long)*local_8 - (long)*local_10 < 8) {
        __assert_fail("*op - *ip >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
      }
      local_c0 = in_RCX + -8;
      if ((long)local_a8 - (long)local_b8 < 8) {
        __assert_fail("op - ip >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa7b4,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
      puVar3 = local_a8;
      if (puVar2 < local_a8) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa7b5,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
    }
    local_a8 = puVar3;
    if (local_b0 < puVar2) {
      if (local_a8 <= local_b0) {
        if (puVar2 <= local_b0) {
          __assert_fail("oend > oend_w",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa7bf,
                        "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                       );
        }
        local_78 = (long)local_b0 - (long)local_a8;
        local_68 = local_a8;
        local_70 = local_b8;
        local_88 = (long)local_a8 - (long)local_b8;
        local_90 = local_b8;
        local_98 = local_a8;
        local_a0 = local_a8 + local_78;
        if ((in_R8D == 1) && (local_88 < 0x10)) {
          do {
            ZSTD_copy8(local_98,local_90);
            local_98 = local_98 + 8;
            local_90 = local_90 + 8;
          } while (local_98 < local_a0);
        }
        else {
          if ((local_88 < 0x10) && (-0x10 < local_88)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(local_a8,local_b8);
          if (0x10 < local_78) {
            local_98 = local_98 + 0x10;
            do {
              local_90 = local_90 + 0x10;
              ZSTD_copy16(local_98,local_90);
              local_98 = local_98 + 0x10;
              local_90 = local_90 + 0x10;
              ZSTD_copy16(local_98,local_90);
              local_98 = local_98 + 0x10;
            } while (local_98 < local_a0);
          }
        }
        local_b8 = local_b8 + ((long)local_b0 - (long)local_a8);
        local_a8 = local_b0;
      }
      while (local_a8 < puVar2) {
        *local_a8 = *local_b8;
        local_b8 = local_b8 + 1;
        local_a8 = local_a8 + 1;
      }
    }
    else {
      local_28 = local_a8;
      local_30 = local_b8;
      local_38 = local_c0;
      local_48 = (long)local_a8 - (long)local_b8;
      local_50 = local_b8;
      local_58 = local_a8;
      local_60 = local_a8 + local_c0;
      if ((in_R8D == 1) && (local_48 < 0x10)) {
        do {
          ZSTD_copy8(local_58,local_50);
          local_58 = local_58 + 8;
          local_50 = local_50 + 8;
        } while (local_58 < local_60);
      }
      else {
        if ((local_48 < 0x10) && (-0x10 < local_48)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(local_a8,local_b8);
        if (0x10 < local_38) {
          local_58 = local_58 + 0x10;
          do {
            local_50 = local_50 + 0x10;
            ZSTD_copy16(local_58,local_50);
            local_58 = local_58 + 0x10;
            local_50 = local_50 + 0x10;
            ZSTD_copy16(local_58,local_50);
            local_58 = local_58 + 0x10;
          } while (local_58 < local_60);
        }
      }
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopy(BYTE* op, const BYTE* const oend_w, BYTE const* ip, ptrdiff_t length, ZSTD_overlap_e ovtype) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    assert((ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) ||
           (ovtype == ZSTD_overlap_src_before_dst && diff >= 0));

    if (length < 8) {
        /* Handle short lengths. */
        while (op < oend) *op++ = *ip++;
        return;
    }
    if (ovtype == ZSTD_overlap_src_before_dst) {
        /* Copy 8 bytes and ensure the offset >= 8 when there can be overlap. */
        assert(length >= 8);
        ZSTD_overlapCopy8(&op, &ip, diff);
        length -= 8;
        assert(op - ip >= 8);
        assert(op <= oend);
    }

    if (oend <= oend_w) {
        /* No risk of overwrite. */
        ZSTD_wildcopy(op, ip, length, ovtype);
        return;
    }
    if (op <= oend_w) {
        /* Wildcopy until we get close to the end. */
        assert(oend > oend_w);
        ZSTD_wildcopy(op, ip, oend_w - op, ovtype);
        ip += oend_w - op;
        op += oend_w - op;
    }
    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}